

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological-sort.cpp
# Opt level: O3

void __thiscall TopologicalSortTest_Empty_Test::TestBody(TopologicalSortTest_Empty_Test *this)

{
  char *message;
  undefined1 local_188 [8];
  TopologicalOrders orders;
  Graph_conflict graph;
  void *local_f8;
  long local_e8;
  void *local_e0;
  long local_d0;
  void *local_c8;
  long local_b8;
  void *local_a8;
  long local_98;
  TopologicalOrdersImpl<std::monostate> local_90;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  orders.selectors.
  super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  graph.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  graph.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)local_188);
  ::wasm::TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
            ((TopologicalOrdersImpl<std::monostate> *)
             &graph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_188);
  ::wasm::TopologicalOrdersImpl<std::monostate>::end
            (&local_90,(TopologicalOrdersImpl<std::monostate> *)local_188);
  testing::internal::
  CmpHelperEQ<wasm::TopologicalOrdersImpl<std::monostate>,wasm::TopologicalOrdersImpl<std::monostate>>
            (local_20,"orders.begin()","orders.end()",
             (TopologicalOrdersImpl<std::monostate> *)
             &graph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_90);
  if (local_90.selectors.
      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.selectors.
                    super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.choiceHeap.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.choiceHeap.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.buf.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.buf.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.indegrees.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8 != (void *)0x0) {
    operator_delete(local_a8,local_98 - (long)local_a8);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  if (local_e0 != (void *)0x0) {
    operator_delete(local_e0,local_d0 - (long)local_e0);
  }
  if (local_f8 != (void *)0x0) {
    operator_delete(local_f8,local_e8 - (long)local_f8);
  }
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message
              ((Message *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/topological-sort.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_90,
               (Message *)
               &graph.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (graph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      (**(code **)(((graph.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start + 2))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  if (orders._80_8_ != 0) {
    operator_delete((void *)orders._80_8_,
                    (long)orders.selectors.
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_finish - orders._80_8_);
  }
  if (orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)orders.choiceHeap.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (orders.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(orders.indegrees.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)orders.buf.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)orders.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (orders.graph != (Graph_conflict *)0x0) {
    operator_delete(orders.graph,
                    (long)orders.indegrees.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)orders.graph);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&orders.selectors.
                super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(TopologicalSortTest, Empty) {
  Graph graph;
  TopologicalOrders orders(graph);
  EXPECT_EQ(orders.begin(), orders.end());
}